

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::reflux(PeleLM *this)

{
  Geometry *geom;
  MultiFab *this_00;
  MultiFab *volume;
  MultiFab *this_01;
  pointer pcVar1;
  ostringstream *this_02;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FluxRegister *this_03;
  FluxRegister *this_04;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer pAVar10;
  PeleLM *pPVar11;
  NavierStokesBase *pNVar12;
  FabArray<amrex::FArrayBox> *this_05;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  pointer pcVar23;
  pointer pcVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  pointer pcVar29;
  pointer pcVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  double dVar35;
  undefined1 auVar36 [16];
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray baf;
  MFIter mfi;
  undefined1 local_378 [32];
  int local_358;
  int local_354;
  int local_350;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_338;
  PeleLM *local_318;
  pointer local_310;
  long local_308;
  Array4<double> local_300;
  undefined1 local_2c0 [104];
  double local_258;
  long local_250;
  pointer local_248;
  long local_240;
  long local_238;
  long local_230;
  pointer local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  undefined1 local_1f0 [24];
  undefined8 uStack_1d8;
  int local_1d0;
  int local_1c8;
  int local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Box local_4c;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level !=
      *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).super_AmrMesh
               .super_AmrInfo.field_0x8c) {
    local_258 = amrex::ParallelDescriptor::second();
    pNVar12 = NavierStokesBase::getLevel
                        (&this->super_NavierStokesBase,
                         (this->super_NavierStokesBase).super_AmrLevel.level + 1);
    this_03 = pNVar12->advflux_reg;
    pNVar12 = NavierStokesBase::getLevel
                        (&this->super_NavierStokesBase,
                         (this->super_NavierStokesBase).super_AmrLevel.level + 1);
    dVar35 = 1.0 / (((this->super_NavierStokesBase).super_AmrLevel.parent)->dt_level).
                   super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->super_NavierStokesBase).super_AmrLevel.level];
    this_04 = pNVar12->viscflux_reg;
    this_00 = &(this->super_NavierStokesBase).Vsync;
    volume = &(this->super_NavierStokesBase).volume;
    geom = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    amrex::FluxRegister::Reflux(this_04,this_00,volume,dVar35,0,0,3,geom);
    if (do_reflux_visc != 0) {
      amrex::FluxRegister::Reflux
                (this_04,&(this->super_NavierStokesBase).Ssync,volume,dVar35,3,0,
                 NavierStokesBase::NUM_STATE + -3,geom);
    }
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"DBGSync","");
    local_2c0._0_8_ = local_2c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"sdc_Ssync_inReflux_AftVisc","");
    this_01 = &(this->super_NavierStokesBase).Ssync;
    iVar19 = (this->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)local_1f0,this_01,(string *)local_2c0,iVar19,
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar19],-1);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_318 = this;
    this_05 = &NavierStokesBase::get_rho_half_time(&this->super_NavierStokesBase)->
               super_FabArray<amrex::FArrayBox>;
    if (NavierStokesBase::do_mom_diff == 0) {
      amrex::MFIter::MFIter((MFIter *)local_1f0,(FabArrayBase *)this_00,true);
      if (local_1d0 < local_1c8) {
        do {
          amrex::MFIter::tilebox((Box *)&local_300,(MFIter *)local_1f0);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_2c0,&this_00->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1f0);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_378,this_05,(MFIter *)local_1f0);
          lVar31 = (long)local_300.p._4_4_;
          pcVar30 = (pointer)(local_2c0._0_8_ +
                             (lVar31 - (int)local_2c0._36_4_) * local_2c0._8_8_ * 8 +
                             (long)(int)local_300.p * 8 + (long)(int)local_2c0._32_4_ * -8);
          lVar15 = 0;
          do {
            iVar19 = (int)local_300.jstride;
            if ((int)local_300.jstride <= local_300.kstride._4_4_) {
              do {
                if (local_300.p._4_4_ <= (int)local_300.kstride) {
                  pcVar24 = pcVar30 + ((long)iVar19 - (long)(int)local_2c0._40_4_) *
                                      local_2c0._16_8_ * 8;
                  pcVar23 = (pointer)(local_378._0_8_ +
                                     ((long)iVar19 - (long)local_350) * local_378._16_8_ * 8 +
                                     (lVar31 - local_354) * local_378._8_8_ * 8 +
                                     (long)(int)local_300.p * 8 + (long)local_358 * -8);
                  lVar28 = lVar31;
                  do {
                    if ((int)local_300.p <= local_300.jstride._4_4_) {
                      lVar14 = 0;
                      do {
                        *(double *)(pcVar24 + lVar14 * 8) =
                             *(double *)(pcVar24 + lVar14 * 8) / *(double *)(pcVar23 + lVar14 * 8);
                        lVar14 = lVar14 + 1;
                      } while ((local_300.jstride._4_4_ - (int)local_300.p) + 1 != (int)lVar14);
                    }
                    lVar28 = lVar28 + 1;
                    pcVar24 = pcVar24 + local_2c0._8_8_ * 8;
                    pcVar23 = pcVar23 + local_378._8_8_ * 8;
                  } while ((int)local_300.kstride + 1 != (int)lVar28);
                }
                bVar34 = iVar19 != local_300.kstride._4_4_;
                iVar19 = iVar19 + 1;
              } while (bVar34);
            }
            lVar15 = lVar15 + 1;
            pcVar30 = pcVar30 + local_2c0._24_8_ * 8;
          } while (lVar15 != 3);
          amrex::MFIter::operator++((MFIter *)local_1f0);
        } while (local_1d0 < local_1c8);
      }
      amrex::MFIter::~MFIter((MFIter *)local_1f0);
    }
    amrex::MFIter::MFIter((MFIter *)local_1f0,(FabArrayBase *)this_01,true);
    if (local_1d0 < local_1c8) {
      do {
        amrex::MFIter::tilebox((Box *)&local_300,(MFIter *)local_1f0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2c0,this_05,(MFIter *)local_1f0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_378,&this_01->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1f0);
        pAVar10 = NavierStokesBase::advectionType.
                  super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
                  super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar15 = (long)NavierStokesBase::NUM_STATE;
        if (3 < lVar15) {
          lVar28 = (long)local_300.p._4_4_;
          pcVar30 = (pointer)(local_378._0_8_ +
                             (lVar28 - local_354) * local_378._8_8_ * 8 + (long)(int)local_300.p * 8
                             + (long)local_358 * -8);
          lVar31 = 3;
          do {
            iVar19 = (int)local_300.jstride;
            if (pAVar10[lVar31] == NonConservative &&
                (int)local_300.jstride <= local_300.kstride._4_4_) {
              do {
                if (local_300.p._4_4_ <= (int)local_300.kstride) {
                  pcVar24 = pcVar30 + ((long)iVar19 - (long)local_350) * local_378._16_8_ * 8;
                  pcVar23 = (pointer)(local_2c0._0_8_ +
                                     ((long)iVar19 - (long)(int)local_2c0._40_4_) *
                                     local_2c0._16_8_ * 8 +
                                     (lVar28 - (int)local_2c0._36_4_) * local_2c0._8_8_ * 8 +
                                     (long)(int)local_300.p * 8 + (long)(int)local_2c0._32_4_ * -8);
                  lVar14 = lVar28;
                  do {
                    if ((int)local_300.p <= local_300.jstride._4_4_) {
                      lVar20 = 0;
                      do {
                        *(double *)(pcVar24 + lVar20 * 8) =
                             *(double *)(pcVar24 + lVar20 * 8) / *(double *)(pcVar23 + lVar20 * 8);
                        lVar20 = lVar20 + 1;
                      } while ((local_300.jstride._4_4_ - (int)local_300.p) + 1 != (int)lVar20);
                    }
                    lVar14 = lVar14 + 1;
                    pcVar24 = pcVar24 + local_378._8_8_ * 8;
                    pcVar23 = pcVar23 + local_2c0._8_8_ * 8;
                  } while ((int)local_300.kstride + 1 != (int)lVar14);
                }
                bVar34 = iVar19 != local_300.kstride._4_4_;
                iVar19 = iVar19 + 1;
              } while (bVar34);
            }
            lVar31 = lVar31 + 1;
            pcVar30 = pcVar30 + local_378._24_8_ * 8;
          } while (lVar31 != lVar15);
        }
        amrex::MFIter::operator++((MFIter *)local_1f0);
      } while (local_1d0 < local_1c8);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1f0);
    amrex::FluxRegister::Reflux(this_03,this_00,volume,dVar35,0,0,3,geom);
    amrex::FluxRegister::Reflux
              (this_03,this_01,volume,dVar35,3,0,NavierStokesBase::NUM_STATE + -3,geom);
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"DBGSync","");
    local_2c0._0_8_ = local_2c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"sdc_Ssync_inReflux_AftAdvReflux","");
    pPVar11 = local_318;
    iVar19 = (local_318->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)local_1f0,this_01,(string *)local_2c0,iVar19,
           (((local_318->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar19],-1);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    amrex::BoxArray::BoxArray
              ((BoxArray *)local_2c0,
               (BoxArray *)
               ((long)(((pPVar11->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(long)(pPVar11->super_NavierStokesBase).super_AmrLevel.level + 1]._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0xd8));
    amrex::BoxArray::coarsen
              ((BoxArray *)local_2c0,&(pPVar11->super_NavierStokesBase).super_AmrLevel.fine_ratio);
    local_338.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MFIter::MFIter((MFIter *)local_1f0,(FabArrayBase *)this_00,true);
    if (local_1d0 < local_1c8) {
      local_68 = -0x80000000;
      uStack_64 = 0x80000000;
      uStack_60 = 0x80000000;
      uStack_5c = 0x80000000;
      do {
        amrex::MFIter::growntilebox(&local_4c,(MFIter *)local_1f0,-1000000);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_378,&this_00->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1f0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_300,&this_01->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1f0);
        iVar19 = NavierStokesBase::NUM_STATE;
        amrex::BoxArray::intersections((BoxArray *)local_2c0,&local_4c,&local_338);
        auVar9 = _DAT_0077bb40;
        auVar8 = _DAT_0077bb30;
        local_310 = local_338.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if ((long)local_338.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_338.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          local_220 = (long)local_338.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_338.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar17 = (ulong)(iVar19 - 3);
          local_220 = local_220 + (ulong)(local_220 == 0);
          lVar15 = uVar17 - 1;
          local_248 = (pointer)(local_378._0_8_ + local_378._24_8_ * 8 + (long)local_358 * -8);
          local_228 = (pointer)(local_378._0_8_ + (long)local_358 * -8);
          local_250 = local_300.nstride * 8 + (long)local_300.begin.x * -8 +
                      CONCAT44(local_300.p._4_4_,(int)local_300.p);
          local_238 = CONCAT44(local_300.p._4_4_,(int)local_300.p) + (long)local_300.begin.x * -8;
          auVar36._8_4_ = (int)lVar15;
          auVar36._0_8_ = lVar15;
          auVar36._12_4_ = (int)((ulong)lVar15 >> 0x20);
          lVar31 = local_378._8_8_ * 8;
          local_230 = -(long)local_354;
          local_308 = local_378._16_8_ * 8;
          local_200 = -(long)local_350;
          lVar28 = CONCAT44(local_300.jstride._4_4_,(int)local_300.jstride) * 8;
          local_240 = -(long)local_300.begin.y;
          local_208 = CONCAT44(local_300.kstride._4_4_,(int)local_300.kstride) * 8;
          local_210 = -(long)local_300.begin.z;
          auVar36 = auVar36 ^ _DAT_0077bb40;
          lVar15 = 0;
          do {
            local_218 = lVar15;
            iVar2 = local_338.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_218].second.smallend.vect[2];
            iVar3 = local_338.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_218].second.bigend.vect[2];
            if (iVar2 <= iVar3) {
              iVar4 = local_338.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_218].second.bigend.vect[0];
              iVar5 = local_338.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_218].second.bigend.vect[1];
              iVar6 = local_338.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_218].second.smallend.vect[1];
              lVar20 = (long)iVar6;
              iVar7 = local_338.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_218].second.smallend.vect[0];
              lVar22 = (long)iVar7;
              lVar15 = (local_230 + lVar20) * lVar31 + lVar22 * 8;
              lVar14 = (local_240 + lVar20) * lVar28 + lVar22 * 8;
              local_1f8 = local_250 + lVar14;
              do {
                if (iVar6 <= iVar5) {
                  lVar16 = (local_210 + iVar2) * local_208;
                  lVar26 = local_1f8 + lVar16;
                  lVar16 = lVar16 + lVar14 + local_238;
                  lVar21 = (iVar2 + local_200) * local_308;
                  pcVar30 = local_248 + lVar21 + lVar15;
                  pcVar23 = local_228 + lVar21 + lVar15;
                  lVar21 = lVar20;
                  do {
                    lVar13 = lVar16;
                    pcVar24 = pcVar30;
                    lVar25 = lVar26;
                    lVar27 = lVar22;
                    pcVar29 = pcVar23;
                    if (iVar7 <= iVar4) {
                      do {
                        lVar18 = 4;
                        lVar32 = 0;
                        auVar39 = auVar8;
                        do {
                          auVar38 = auVar39 ^ auVar9;
                          if (auVar38._4_4_ == local_68 && auVar38._0_4_ < -0x7ffffffd) {
                            pcVar1 = pcVar29 + lVar32;
                            pcVar1[0] = '\0';
                            pcVar1[1] = '\0';
                            pcVar1[2] = '\0';
                            pcVar1[3] = '\0';
                            pcVar1[4] = '\0';
                            pcVar1[5] = '\0';
                            pcVar1[6] = '\0';
                            pcVar1[7] = '\0';
                            pcVar1 = pcVar24 + lVar32;
                            pcVar1[0] = '\0';
                            pcVar1[1] = '\0';
                            pcVar1[2] = '\0';
                            pcVar1[3] = '\0';
                            pcVar1[4] = '\0';
                            pcVar1[5] = '\0';
                            pcVar1[6] = '\0';
                            pcVar1[7] = '\0';
                          }
                          lVar37 = auVar39._8_8_;
                          auVar39._0_8_ = auVar39._0_8_ + 2;
                          auVar39._8_8_ = lVar37 + 2;
                          lVar32 = lVar32 + local_378._24_8_ * 0x10;
                          lVar18 = lVar18 + -2;
                        } while (lVar18 != 0);
                        if (3 < iVar19) {
                          lVar18 = 0;
                          uVar33 = uVar17 + 1 & 0xfffffffffffffffe;
                          auVar38 = auVar8;
                          do {
                            auVar39 = auVar38 ^ auVar9;
                            if ((bool)(~(auVar36._4_4_ < auVar39._4_4_ ||
                                        auVar36._0_4_ < auVar39._0_4_ &&
                                        auVar39._4_4_ == auVar36._4_4_) & 1)) {
                              *(undefined8 *)(lVar13 + lVar18) = 0;
                            }
                            if (auVar39._12_4_ <= auVar36._12_4_ &&
                                (auVar39._8_4_ <= auVar36._8_4_ || auVar39._12_4_ != auVar36._12_4_)
                               ) {
                              *(undefined8 *)(lVar25 + lVar18) = 0;
                            }
                            lVar32 = auVar38._8_8_;
                            auVar38._0_8_ = auVar38._0_8_ + 2;
                            auVar38._8_8_ = lVar32 + 2;
                            lVar18 = lVar18 + local_300.nstride * 0x10;
                            uVar33 = uVar33 - 2;
                          } while (uVar33 != 0);
                        }
                        lVar27 = lVar27 + 1;
                        pcVar24 = pcVar24 + 8;
                        pcVar29 = pcVar29 + 8;
                        lVar25 = lVar25 + 8;
                        lVar13 = lVar13 + 8;
                      } while (iVar4 + 1 != (int)lVar27);
                    }
                    lVar21 = lVar21 + 1;
                    pcVar30 = pcVar30 + lVar31;
                    pcVar23 = pcVar23 + lVar31;
                    lVar26 = lVar26 + lVar28;
                    lVar16 = lVar16 + lVar28;
                  } while (iVar5 + 1 != (int)lVar21);
                }
                bVar34 = iVar2 != iVar3;
                iVar2 = iVar2 + 1;
              } while (bVar34);
            }
            lVar15 = local_218 + 1;
          } while (local_218 + 1 != local_220);
        }
        amrex::MFIter::operator++((MFIter *)local_1f0);
      } while (local_1d0 < local_1c8);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1f0);
    if (local_338.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_338.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_338.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"DBGSync","");
    pPVar11 = local_318;
    local_378._0_8_ = local_378 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"sdc_Ssync_inReflux_AftZerosFine","");
    iVar19 = (pPVar11->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)local_1f0,this_01,(string *)local_378,iVar19,
           (((pPVar11->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar19],-1);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (2 < NavierStokesBase::verbose) {
      dVar35 = amrex::ParallelDescriptor::second();
      local_1f0._8_8_ = amrex::OutStream();
      this_02 = (ostringstream *)(local_1f0 + 0x10);
      local_1f0._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_1f0._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_02);
      *(undefined8 *)((long)&uStack_1d8 + *(long *)(local_1f0._16_8_ - 0x18)) =
           *(undefined8 *)
            ((*(_func_int ***)local_1f0._8_8_)[-3] +
            (long)&((BoxArray *)(local_1f0._8_8_ + 8))->m_bat);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_02,"      PeleLM::Reflux(): lev: ",0x1d);
      std::ostream::operator<<(this_02,(pPVar11->super_NavierStokesBase).super_AmrLevel.level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,", time: ",8);
      std::ostream::_M_insert<double>(dVar35 - local_258);
      local_378[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,local_378,1);
      amrex::Print::~Print((Print *)local_1f0);
    }
    amrex::BoxArray::~BoxArray((BoxArray *)local_2c0);
  }
  return;
}

Assistant:

void
PeleLM::reflux ()
{
   BL_PROFILE("PLM::reflux()");

   // no need to reflux if this is the finest level
   if (level == parent->finestLevel()) return;

   const Real strt_time = ParallelDescriptor::second();

   AMREX_ASSERT(do_reflux);

   //
   // First do refluxing step.
   //
   FluxRegister& fr_adv  = getAdvFluxReg(level+1);
   FluxRegister& fr_visc = getViscFluxReg(level+1);
   const Real    dt_crse = parent->dtLevel(level);
   const Real    scale   = 1.0/dt_crse;
   //
   // It is important, for do_mom_diff == 0, to do the viscous
   //   refluxing first, since this will be divided by rho_half
   //   before the advective refluxing is added.  In the case of
   //   do_mom_diff == 1, both components of the refluxing will
   //   be divided by rho^(n+1) in NavierStokesBase::level_sync.
   //
   // take divergence of diffusive flux registers into cell-centered RHS
   fr_visc.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   if (do_reflux_visc)
     fr_visc.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);

   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftVisc",level,parent->levelSteps(level));

   const MultiFab& RhoHalftime = get_rho_half_time();

   if (do_mom_diff == 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& rhohalf = RhoHalftime.const_array(mfi);

         amrex::ParallelFor(bx, AMREX_SPACEDIM, [vsync, rhohalf]
         AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
         {
            vsync(i,j,k,n) /= rhohalf(i,j,k);
         });
      }
   }

   // for any variables that used non-conservative advective differencing,
   // divide the sync by rhohalf
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Ssync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhohalf = RhoHalftime.const_array(mfi);
      auto const& ssync   = Ssync.array(mfi);
      for (int istate = AMREX_SPACEDIM; istate < NUM_STATE; istate++)
      {
         if (advectionType[istate] == NonConservative)
         {
            const int sigma = istate - AMREX_SPACEDIM;
            amrex::ParallelFor(bx, [ssync, rhohalf, sigma]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               ssync(i,j,k,sigma) /= rhohalf(i,j,k);
            });
         }
      }
   }

   // take divergence of advective flux registers into cell-centered RHS
   fr_adv.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   fr_adv.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftAdvReflux",level,parent->levelSteps(level));

   //
   // This is necessary in order to zero out the contribution to any
   // coarse grid cells which underlie fine grid cells.
   //
   BoxArray baf = getLevel(level+1).boxArray();
   baf.coarsen(fine_ratio);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      std::vector< std::pair<int,Box> > isects;
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.growntilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& ssync   = Ssync.array(mfi);
         int nstate          = NUM_STATE;

         baf.intersections(bx,isects);

         for (long unsigned int it = 0, N = isects.size(); it < N; it++) {
            amrex::ParallelFor(isects[it].second, [vsync, ssync, nstate]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               for (int n = 0; n < AMREX_SPACEDIM; n++) {
                  vsync(i,j,k,n) = 0.0;
               }
               for (int n = 0; n < nstate-AMREX_SPACEDIM; n++) {
                  ssync(i,j,k,n) = 0.0;
               }
            });
         }
      }
   }
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftZerosFine",level,parent->levelSteps(level));

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::Reflux(): lev: " << level << ", time: " << run_time << '\n';
   }
}